

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O3

void __thiscall BCL::read<char>(BCL *this,GlobalPtr<const_char> src,char *dst,size_t size)

{
  int iVar1;
  long *plVar2;
  debug_error *pdVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  MPI_Request request;
  
  if (my_nprocs < this) {
    pdVar3 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string((string *)&request,(unsigned_long)this);
    std::operator+(&local_80,"BCL read(): request to read from rank ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&request);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_60._M_dataplus._M_p = (pointer)*plVar2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_60._M_dataplus._M_p == psVar4) {
      local_60.field_2._M_allocated_capacity = *psVar4;
      local_60.field_2._8_8_ = plVar2[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar4;
    }
    local_60._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    debug_error::debug_error(pdVar3,&local_60);
    __cxa_throw(pdVar3,&debug_error::typeinfo,debug_error::~debug_error);
  }
  iVar1 = MPI_Rget(src.ptr,(ulong)dst & 0xffffffff,&ompi_mpi_char,(ulong)this & 0xffffffff,src.rank,
                   dst,&ompi_mpi_char,win,&request);
  if (iVar1 == 0) {
    iVar1 = MPI_Wait(&request,0);
    if (iVar1 == 0) {
      return;
    }
    pdVar3 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_80,iVar1);
    std::operator+(&local_60,"BCL read(): MPI_Wait returned error code ",&local_80);
    debug_error::debug_error(pdVar3,&local_60);
    __cxa_throw(pdVar3,&debug_error::typeinfo,debug_error::~debug_error);
  }
  pdVar3 = (debug_error *)__cxa_allocate_exception(0x40);
  std::__cxx11::to_string(&local_80,iVar1);
  std::operator+(&local_60,"BCL read(): MPI_Rget returned error code ",&local_80);
  debug_error::debug_error(pdVar3,&local_60);
  __cxa_throw(pdVar3,&debug_error::typeinfo,debug_error::~debug_error);
}

Assistant:

inline void read(GlobalPtr<std::add_const_t<T>> src, T *dst, std::size_t size) {
  BCL_DEBUG(
    if (src.rank > BCL::backend::nprocs()) {
      throw debug_error("BCL read(): request to read from rank " +
                        std::to_string(src.rank) + ", which does not exist");
    }
  )
  /*
  if (src.rank == BCL::rank()) {
    std::memcpy(dst, src.local(), size*sizeof(T));
  } else {
    MPI_Request request;
    MPI_Rget(dst, size*sizeof(T), MPI_CHAR, src.rank, src.ptr, size*sizeof(T),
      MPI_CHAR, BCL::win, &request);
    MPI_Wait(&request, MPI_STATUS_IGNORE);
  }
  */
  MPI_Request request;

  int error_code = MPI_Rget(dst, size*sizeof(T), MPI_CHAR,
                            src.rank, src.ptr, size*sizeof(T), MPI_CHAR,
                            BCL::win, &request);
  BCL_DEBUG(
    if (error_code != MPI_SUCCESS) {
      throw debug_error("BCL read(): MPI_Rget returned error code " + std::to_string(error_code));
    }
  )

  error_code = MPI_Wait(&request, MPI_STATUS_IGNORE);
  BCL_DEBUG(
    if (error_code != MPI_SUCCESS) {
      throw debug_error("BCL read(): MPI_Wait returned error code " + std::to_string(error_code));
    }
  )
}